

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_tcp_connection.cc
# Opt level: O3

int __thiscall AliTcpConnection::Connect(AliTcpConnection *this)

{
  char *__name;
  sockaddr *psVar1;
  addrinfo *paVar2;
  int iVar3;
  addrinfo *res0;
  sockaddr_in addr;
  addrinfo *local_80;
  sockaddr local_78;
  char local_68 [32];
  addrinfo local_48;
  
  iVar3 = socket(2,1,6);
  this->fd_ = iVar3;
  local_78.sa_family = 0;
  local_78.sa_data[0] = '\0';
  local_78.sa_data[1] = '\0';
  local_78.sa_data[2] = '\0';
  local_78.sa_data[3] = '\0';
  local_78.sa_data[4] = '\0';
  local_78.sa_data[5] = '\0';
  local_78.sa_data[6] = '\0';
  local_78.sa_data[7] = '\0';
  local_78.sa_data[8] = '\0';
  local_78.sa_data[9] = '\0';
  local_78.sa_data[10] = '\0';
  local_78.sa_data[0xb] = '\0';
  local_78.sa_data[0xc] = '\0';
  local_78.sa_data[0xd] = '\0';
  __name = (this->host_)._M_dataplus._M_p;
  local_68[0x10] = '\0';
  local_68[0x11] = '\0';
  local_68[0x12] = '\0';
  local_68[0x13] = '\0';
  local_68[0x14] = '\0';
  local_68[0x15] = '\0';
  local_68[0x16] = '\0';
  local_68[0x17] = '\0';
  local_68[0x18] = '\0';
  local_68[0x19] = '\0';
  local_68[0x1a] = '\0';
  local_68[0x1b] = '\0';
  local_68[0x1c] = '\0';
  local_68[0x1d] = '\0';
  local_68[0x1e] = '\0';
  local_68[0x1f] = '\0';
  local_68[0] = '\0';
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = '\0';
  local_68[8] = '\0';
  local_68[9] = '\0';
  local_68[10] = '\0';
  local_68[0xb] = '\0';
  local_68[0xc] = '\0';
  local_68[0xd] = '\0';
  local_68[0xe] = '\0';
  local_68[0xf] = '\0';
  snprintf(local_68,0x20,"%d",(ulong)(uint)this->port_);
  local_48.ai_addrlen = 0;
  local_48._20_4_ = 0;
  local_48.ai_addr = (sockaddr *)0x0;
  local_48.ai_canonname = (char *)0x0;
  local_48.ai_next = (addrinfo *)0x0;
  local_48.ai_socktype = 1;
  local_48.ai_protocol = 6;
  local_48.ai_flags = 1;
  local_48.ai_family = 0;
  iVar3 = getaddrinfo(__name,local_68,&local_48,&local_80);
  paVar2 = local_80;
  if (iVar3 == 0) {
    for (; paVar2 != (addrinfo *)0x0; paVar2 = paVar2->ai_next) {
      if (paVar2->ai_family == 10) {
        freeaddrinfo(local_80);
        goto LAB_0014b4c1;
      }
      if (paVar2->ai_family == 2) {
        psVar1 = paVar2->ai_addr;
        local_78.sa_family = psVar1->sa_family;
        local_78.sa_data[0] = psVar1->sa_data[0];
        local_78.sa_data[1] = psVar1->sa_data[1];
        local_78.sa_data[2] = psVar1->sa_data[2];
        local_78.sa_data[3] = psVar1->sa_data[3];
        local_78.sa_data[4] = psVar1->sa_data[4];
        local_78.sa_data[5] = psVar1->sa_data[5];
        local_78.sa_data._6_8_ = *(undefined8 *)(psVar1->sa_data + 6);
        break;
      }
    }
    freeaddrinfo(local_80);
    iVar3 = connect(this->fd_,&local_78,0x10);
  }
  else {
LAB_0014b4c1:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int AliTcpConnection::Connect() {
  fd_ = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);
  sockaddr_in addr = {};
  if(resolve_dns(host_.c_str(), port_, (sockaddr*)&addr) != 0) {\
    goto err_failed;
  }

  return ::connect(fd_, (sockaddr*)&addr, sizeof(sockaddr_in));
err_failed:
  return -1;
}